

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tet_weighted_ideal(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_location)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  REF_INT tet;
  REF_STATUS RVar8;
  ulong uVar9;
  double dVar10;
  REF_DBL quality;
  REF_DBL tet_ideal [3];
  REF_INT nodes [27];
  double local_d8;
  double local_d0;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  *ideal_location = 0.0;
  ideal_location[1] = 0.0;
  ideal_location[2] = 0.0;
  local_d8 = 0.0;
  if (-1 < node) {
    pRVar1 = ref_grid->cell[8]->ref_adj;
    if ((node < pRVar1->nnode) && (lVar7 = (long)pRVar1->first[(uint)node], lVar7 != -1)) {
      tet = pRVar1->item[lVar7].ref;
      uVar3 = ref_smooth_tet_ideal(ref_grid,node,tet,local_c8);
      if (uVar3 == 0) {
        local_d8 = 0.0;
        do {
          uVar3 = ref_cell_nodes(ref_grid->cell[8],tet,local_a8);
          if (uVar3 != 0) {
            uVar9 = (ulong)uVar3;
            pcVar6 = "nodes";
            uVar5 = 0x56a;
            goto LAB_001b7e0b;
          }
          uVar3 = ref_node_tet_quality(ref_grid->node,local_a8,&local_d0);
          if (uVar3 != 0) {
            uVar9 = (ulong)uVar3;
            pcVar6 = "tet qual";
            uVar5 = 0x56c;
            goto LAB_001b7e0b;
          }
          dVar10 = ref_grid->adapt->smooth_min_quality;
          if (local_d0 <= dVar10) {
            local_d0 = dVar10;
          }
          lVar4 = 0;
          do {
            ideal_location[lVar4] = local_c8[lVar4] * (1.0 / local_d0) + ideal_location[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
          local_d8 = local_d8 + 1.0 / local_d0;
          pRVar2 = ref_grid->cell[8]->ref_adj->item;
          lVar7 = (long)pRVar2[(int)lVar7].next;
          if (lVar7 == -1) goto LAB_001b7ee6;
          tet = pRVar2[lVar7].ref;
          uVar3 = ref_smooth_tet_ideal(ref_grid,node,tet,local_c8);
        } while (uVar3 == 0);
      }
      uVar9 = (ulong)uVar3;
      pcVar6 = "tet ideal";
      uVar5 = 0x569;
LAB_001b7e0b:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             uVar5,"ref_smooth_tet_weighted_ideal",uVar9,pcVar6);
      return (REF_STATUS)uVar9;
    }
  }
LAB_001b7ee6:
  dVar10 = local_d8 * 1e+20;
  if (dVar10 <= -dVar10) {
    dVar10 = -dVar10;
  }
  if (dVar10 <= 1.0) {
    printf("normalization = %e\n");
    RVar8 = 4;
  }
  else {
    RVar8 = 0;
    lVar7 = 0;
    do {
      ideal_location[lVar7] = ideal_location[lVar7] * (1.0 / local_d8);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
  }
  return RVar8;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_weighted_ideal(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *ideal_location) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ixyz;
  REF_DBL tet_ideal[3];
  REF_DBL quality, weight, normalization;

  normalization = 0.0;
  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] = 0.0;

  each_ref_cell_having_node(ref_grid_tet(ref_grid), node, item, cell) {
    RSS(ref_smooth_tet_ideal(ref_grid, node, cell, tet_ideal), "tet ideal");
    RSS(ref_cell_nodes(ref_grid_tet(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tet qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] += weight * tet_ideal[ixyz];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] = (1.0 / normalization) * ideal_location[ixyz];
  } else {
    printf("normalization = %e\n", normalization);
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}